

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ** __thiscall ImGuiStorage::GetVoidPtrRef(ImGuiStorage *this,ImGuiID key,void *default_val)

{
  Pair *it_00;
  Pair *pPVar1;
  Pair *pPVar2;
  Pair local_38;
  Pair *local_28;
  Pair *it;
  void *default_val_local;
  ImGuiStorage *pIStack_10;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it = (Pair *)default_val;
  default_val_local._4_4_ = key;
  pIStack_10 = this;
  pPVar1 = LowerBound(&this->Data,key);
  local_28 = pPVar1;
  pPVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  it_00 = local_28;
  if ((pPVar1 == pPVar2) || (local_28->key != default_val_local._4_4_)) {
    Pair::Pair(&local_38,default_val_local._4_4_,it);
    local_28 = ImVector<ImGuiStorage::Pair>::insert(&this->Data,it_00,&local_38);
  }
  return (void **)&local_28->field_1;
}

Assistant:

void** ImGuiStorage::GetVoidPtrRef(ImGuiID key, void* default_val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_p;
}